

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Animatable<tinyusdz::Token>::get_scalar(Animatable<tinyusdz::Token> *this,Token *v)

{
  if (((v != (Token *)0x0) && (this->_blocked == false)) && (this->_has_value == true)) {
    ::std::__cxx11::string::_M_assign((string *)v);
    return true;
  }
  return false;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }